

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::Finalize<duckdb::RegrState,double,duckdb::RegrAvgXFunction>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  idx_t iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    local_48.result_idx = 0;
    dVar1 = ((double *)**(undefined8 **)(states + 0x20))[1];
    if (dVar1 == 0.0) {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
    else {
      auVar6._8_4_ = (int)((ulong)dVar1 >> 0x20);
      auVar6._0_8_ = dVar1;
      auVar6._12_4_ = 0x45300000;
      **(double **)(result + 0x20) =
           *(double *)**(undefined8 **)(states + 0x20) /
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0));
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    lVar2 = *(long *)(states + 0x20);
    lVar3 = *(long *)(result + 0x20);
    if (count != 0) {
      iVar5 = 0;
      do {
        local_48.result_idx = offset + iVar5;
        pdVar4 = *(double **)(lVar2 + iVar5 * 8);
        dVar1 = pdVar4[1];
        if (dVar1 == 0.0) {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        else {
          auVar7._8_4_ = (int)((ulong)dVar1 >> 0x20);
          auVar7._0_8_ = dVar1;
          auVar7._12_4_ = 0x45300000;
          *(double *)(lVar3 + offset * 8 + iVar5 * 8) =
               *pdVar4 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0));
        }
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}